

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O1

bool ghc::filesystem::create_directory(path *p,path *attributes,error_code *ec)

{
  int iVar1;
  error_category *peVar2;
  int *piVar3;
  file_status fs;
  error_code tec;
  stat fileStat;
  undefined1 local_d8 [48];
  __mode_t local_a8;
  
  local_d8._8_4_ = 0;
  peVar2 = (error_category *)std::_V2::system_category();
  ec->_M_value = 0;
  ec->_M_cat = peVar2;
  local_d8._16_8_ = peVar2;
  detail::status_ex((path *)local_d8,(error_code *)p,(file_status *)(local_d8 + 8),(uintmax_t *)0x0,
                    (uintmax_t *)0x0,(time_t *)0x0,0);
  if (local_d8._0_4_ == 3) {
    return false;
  }
  if ((attributes->_path)._M_string_length == 0) {
    local_a8 = 0x1ff;
  }
  else {
    iVar1 = stat((attributes->_path)._M_dataplus._M_p,(stat *)(local_d8 + 0x18));
    if (iVar1 != 0) {
      piVar3 = __errno_location();
      ec->_M_value = *piVar3;
      ec->_M_cat = peVar2;
      return false;
    }
  }
  iVar1 = mkdir((p->_path)._M_dataplus._M_p,local_a8);
  if (iVar1 != 0) {
    piVar3 = __errno_location();
    ec->_M_value = *piVar3;
    ec->_M_cat = peVar2;
    return false;
  }
  return true;
}

Assistant:

GHC_INLINE bool create_directory(const path& p, const path& attributes, std::error_code& ec) noexcept
{
    std::error_code tec;
    ec.clear();
    auto fs = status(p, tec);
#ifdef LWG_2935_BEHAVIOUR
    if (status_known(fs) && exists(fs)) {
        return false;
    }
#else
    if (status_known(fs) && exists(fs) && is_directory(fs)) {
        return false;
    }
#endif
#ifdef GHC_OS_WINDOWS
    if (!attributes.empty()) {
        if (!::CreateDirectoryExW(GHC_NATIVEWP(attributes), GHC_NATIVEWP(p), NULL)) {
            ec = detail::make_system_error();
            return false;
        }
    }
    else if (!::CreateDirectoryW(GHC_NATIVEWP(p), NULL)) {
        ec = detail::make_system_error();
        return false;
    }
#else
    ::mode_t attribs = static_cast<mode_t>(perms::all);
    if (!attributes.empty()) {
        struct ::stat fileStat;
        if (::stat(attributes.c_str(), &fileStat) != 0) {
            ec = detail::make_system_error();
            return false;
        }
        attribs = fileStat.st_mode;
    }
    if (::mkdir(p.c_str(), attribs) != 0) {
        ec = detail::make_system_error();
        return false;
    }
#endif
    return true;
}